

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_highbd_smooth_h_predictor_32x16_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  long lVar1;
  int c;
  long lVar2;
  int iVar3;
  long lVar4;
  byte local_16 [2];
  uint16_t local_14 [2];
  uint8_t weights [2];
  uint16_t pixels [2];
  
  local_14[1] = above[0x1f];
  lVar1 = 0;
  do {
    lVar2 = 0;
    do {
      local_14[0] = left[lVar1];
      local_16[0] = smooth_weights[lVar2 + 0x1c];
      local_16[1] = -smooth_weights[lVar2 + 0x1c];
      lVar4 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + (uint)local_14[lVar4] * (uint)local_16[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      dst[lVar2] = (uint16_t)((uint)(iVar3 + 0x80) >> 8);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    dst = dst + stride;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

static inline void highbd_smooth_h_predictor(uint16_t *dst, ptrdiff_t stride,
                                             int bw, int bh,
                                             const uint16_t *above,
                                             const uint16_t *left, int bd) {
  (void)bd;
  const uint16_t right_pred = above[bw - 1];  // estimated by top-right pixel
  const uint8_t *const sm_weights = smooth_weights + bw - 4;
  // scale = 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights, sm_weights, scale,
                           log2_scale + sizeof(*dst));

  int r;
  for (r = 0; r < bh; r++) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint16_t pixels[] = { left[r], right_pred };
      const uint8_t weights[] = { sm_weights[c], scale - sm_weights[c] };
      uint32_t this_pred = 0;
      assert(scale >= sm_weights[c]);
      int i;
      for (i = 0; i < 2; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}